

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemFromBtree(BtCursor *pCur,u32 offset,u32 amt,Mem *pMem)

{
  sqlite3_int64 sVar1;
  int local_2c;
  int rc;
  Mem *pMem_local;
  u32 amt_local;
  u32 offset_local;
  BtCursor *pCur_local;
  
  pMem->flags = 1;
  sVar1 = sqlite3BtreeMaxRecordSize(pCur);
  if (sVar1 < (long)(ulong)(offset + amt)) {
    pCur_local._4_4_ = sqlite3CorruptError(0x13d2f);
  }
  else {
    local_2c = sqlite3VdbeMemClearAndResize(pMem,amt + 1);
    if (local_2c == 0) {
      local_2c = sqlite3BtreePayload(pCur,offset,amt,pMem->z);
      if (local_2c == 0) {
        pMem->z[amt] = '\0';
        pMem->flags = 0x10;
        pMem->n = amt;
      }
      else {
        sqlite3VdbeMemRelease(pMem);
      }
    }
    pCur_local._4_4_ = local_2c;
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtree(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 offset,       /* Offset from the start of data to return bytes from. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  int rc;
  pMem->flags = MEM_Null;
  if( sqlite3BtreeMaxRecordSize(pCur)<offset+amt ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( SQLITE_OK==(rc = sqlite3VdbeMemClearAndResize(pMem, amt+1)) ){
    rc = sqlite3BtreePayload(pCur, offset, amt, pMem->z);
    if( rc==SQLITE_OK ){
      pMem->z[amt] = 0;   /* Overrun area used when reading malformed records */
      pMem->flags = MEM_Blob;
      pMem->n = (int)amt;
    }else{
      sqlite3VdbeMemRelease(pMem);
    }
  }
  return rc;
}